

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

Status __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolver::ResolveEnumType
          (DescriptorPoolTypeResolver *this,string *type_url,Enum *enum_type)

{
  EnumDescriptor *descriptor;
  Enum *in_RCX;
  string_view type_url_00;
  string_view name;
  string_view message;
  Status status;
  string type_name;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  AlphaNum *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  Enum local_b0;
  AlphaNum local_48;
  
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = (AlphaNum *)0x0;
  local_e0._M_local_buf[0] = '\0';
  type_url_00._M_str = (char *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_
  ;
  type_url_00._M_len = (size_t)type_url;
  ParseTypeUrl((DescriptorPoolTypeResolver *)local_f8,type_url_00,
               (string *)(enum_type->super_Message).super_MessageLite._vptr_MessageLite);
  if (local_f8 == (undefined1  [8])0x1) {
    name._M_str = local_f0._M_p;
    name._M_len = (size_t)local_e8;
    descriptor = DescriptorPool::FindEnumTypeByName
                           ((DescriptorPool *)type_url[1]._M_string_length,name);
    if (descriptor == (EnumDescriptor *)0x0) {
      local_b0.super_Message.super_MessageLite =
           (MessageLite)absl::lts_20250127::NullSafeStringView("Invalid type URL, unknown type: ");
      local_48.piece_._M_len = (size_t)local_e8;
      local_48.piece_._M_str = local_f0._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_(&local_d0,(lts_20250127 *)&local_b0,&local_48,local_e8);
      message._M_str = (char *)local_d0._M_string_length;
      message._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      ConvertDescriptorToType(&local_b0,descriptor);
      Enum::operator=(in_RCX,&local_b0);
      Enum::~Enum(&local_b0);
      (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)0x1;
    }
  }
  else {
    (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)local_f8;
    local_f8 = (undefined1  [8])0x37;
  }
  absl::lts_20250127::Status::~Status((Status *)local_f8);
  std::__cxx11::string::~string((string *)&local_f0);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ResolveEnumType(const std::string& type_url,
                               Enum* enum_type) override {
    std::string type_name;
    absl::Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const EnumDescriptor* descriptor = pool_->FindEnumTypeByName(type_name);
    if (descriptor == nullptr) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, unknown type: ", type_name));
    }
    *enum_type = ConvertDescriptorToType(*descriptor);
    return absl::Status();
  }